

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d_sse4.c
# Opt level: O1

void lowbd_fwd_txfm2d_32x64_sse4_1(int16_t *input,int32_t *output,int stride,TX_TYPE tx_type,int bd)

{
  undefined4 *puVar1;
  byte bVar2;
  undefined2 uVar3;
  undefined8 uVar4;
  undefined1 auVar5 [12];
  undefined1 auVar6 [12];
  undefined1 auVar7 [12];
  undefined1 auVar8 [12];
  int8_t *piVar9;
  int16_t *piVar10;
  uint uVar11;
  long lVar12;
  int iVar13;
  int32_t *piVar14;
  long lVar15;
  undefined1 *puVar16;
  undefined4 uVar17;
  __m128i round;
  undefined1 auVar19 [16];
  undefined1 auVar21 [16];
  undefined4 uVar22;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar40 [16];
  undefined4 uVar41;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar50 [16];
  undefined4 uVar51;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  __m128i buf0 [64];
  __m128i bufB [32];
  __m128i bufA [32];
  __m128i buf1 [256];
  longlong local_1838 [2];
  undefined2 auStack_1828 [8];
  undefined1 auStack_1818 [16];
  undefined2 auStack_1808 [8];
  undefined1 auStack_17f8 [16];
  undefined2 auStack_17e8 [8];
  undefined1 auStack_17d8 [16];
  undefined2 auStack_17c8 [456];
  undefined8 local_1438;
  int aiStack_1430 [126];
  undefined8 local_1238;
  int aiStack_1230 [126];
  undefined1 local_1038 [112];
  undefined1 local_fc8 [3992];
  undefined1 auVar18 [12];
  undefined1 auVar20 [16];
  undefined1 auVar23 [12];
  undefined1 auVar24 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar42 [12];
  undefined1 auVar43 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar52 [12];
  undefined1 auVar53 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  
  piVar9 = av1_fwd_txfm_shift_ls[0xb];
  puVar16 = local_fc8;
  lVar15 = 0;
  do {
    lVar12 = 0;
    piVar10 = input;
    do {
      uVar4 = *(undefined8 *)(piVar10 + 4);
      *(undefined8 *)((long)local_1838 + lVar12) = *(undefined8 *)piVar10;
      *(undefined8 *)((long)auStack_1828 + lVar12 + -8) = uVar4;
      lVar12 = lVar12 + 0x10;
      piVar10 = piVar10 + stride;
    } while (lVar12 != 0x400);
    bVar2 = *piVar9;
    if ((char)bVar2 < '\0') {
      auVar19 = ZEXT416((uint)(1 << (~bVar2 & 0x1f)));
      auVar19 = pshuflw(auVar19,auVar19,0);
      auVar19._4_4_ = auVar19._0_4_;
      auVar19._8_4_ = auVar19._0_4_;
      auVar19._12_4_ = auVar19._0_4_;
      lVar12 = 0;
      do {
        auVar34 = paddsw(*(undefined1 (*) [16])((long)local_1838 + lVar12),auVar19);
        auVar34 = psraw(auVar34,ZEXT416((uint)-(int)(char)bVar2));
        *(undefined1 (*) [16])((long)local_1838 + lVar12) = auVar34;
        lVar12 = lVar12 + 0x10;
      } while (lVar12 != 0x400);
    }
    else if (bVar2 != 0) {
      lVar12 = 0;
      do {
        auVar19 = psllw(*(undefined1 (*) [16])((long)local_1838 + lVar12),
                        ZEXT416((uint)(int)(char)bVar2));
        *(undefined1 (*) [16])((long)local_1838 + lVar12) = auVar19;
        lVar12 = lVar12 + 0x10;
      } while (lVar12 != 0x400);
    }
    av1_fdct8x64_new_sse2(&local_1838,&local_1838,'\r');
    bVar2 = piVar9[1];
    uVar11 = (uint)(char)bVar2;
    if ((int)uVar11 < 0) {
      auVar19 = ZEXT416((uint)(1 << (~bVar2 & 0x1f)));
      auVar19 = pshuflw(auVar19,auVar19,0);
      auVar34._0_4_ = auVar19._0_4_;
      auVar34._4_4_ = auVar34._0_4_;
      auVar34._8_4_ = auVar34._0_4_;
      auVar34._12_4_ = auVar34._0_4_;
      lVar12 = 0;
      do {
        auVar19 = paddsw(*(undefined1 (*) [16])((long)local_1838 + lVar12),auVar34);
        auVar19 = psraw(auVar19,ZEXT416(-uVar11));
        *(undefined1 (*) [16])((long)local_1838 + lVar12) = auVar19;
        lVar12 = lVar12 + 0x10;
      } while (lVar12 != 0x400);
    }
    else if (bVar2 != 0) {
      lVar12 = 0;
      do {
        auVar19 = psllw(*(undefined1 (*) [16])((long)local_1838 + lVar12),ZEXT416(uVar11));
        *(undefined1 (*) [16])((long)local_1838 + lVar12) = auVar19;
        lVar12 = lVar12 + 0x10;
      } while (lVar12 != 0x400);
    }
    lVar12 = 0;
    do {
      auVar19 = *(undefined1 (*) [16])((long)local_1838 + lVar12);
      auVar34 = *(undefined1 (*) [16])((long)auStack_1828 + lVar12 + 0x10);
      auVar31._0_12_ = auVar19._0_12_;
      auVar31._12_2_ = auVar19._6_2_;
      auVar31._14_2_ = *(undefined2 *)((long)auStack_1828 + lVar12 + 6);
      auVar30._12_4_ = auVar31._12_4_;
      auVar30._0_10_ = auVar19._0_10_;
      auVar30._10_2_ = *(undefined2 *)((long)auStack_1828 + lVar12 + 4);
      auVar29._10_6_ = auVar30._10_6_;
      auVar29._0_8_ = auVar19._0_8_;
      auVar29._8_2_ = auVar19._4_2_;
      auVar5._4_8_ = auVar29._8_8_;
      auVar5._2_2_ = *(undefined2 *)((long)auStack_1828 + lVar12 + 2);
      auVar5._0_2_ = auVar19._2_2_;
      auVar28._0_4_ = CONCAT22(*(undefined2 *)((long)auStack_1828 + lVar12),auVar19._0_2_);
      auVar28._4_12_ = auVar5;
      auVar49._0_12_ = auVar34._0_12_;
      auVar49._12_2_ = auVar34._6_2_;
      auVar49._14_2_ = *(undefined2 *)((long)auStack_1808 + lVar12 + 6);
      auVar48._12_4_ = auVar49._12_4_;
      auVar48._0_10_ = auVar34._0_10_;
      auVar48._10_2_ = *(undefined2 *)((long)auStack_1808 + lVar12 + 4);
      auVar47._10_6_ = auVar48._10_6_;
      auVar47._0_8_ = auVar34._0_8_;
      auVar47._8_2_ = auVar34._4_2_;
      auVar6._4_8_ = auVar47._8_8_;
      auVar6._2_2_ = *(undefined2 *)((long)auStack_1808 + lVar12 + 2);
      auVar6._0_2_ = auVar34._2_2_;
      auVar24 = *(undefined1 (*) [16])((long)auStack_1808 + lVar12 + 0x10);
      auVar39._0_12_ = auVar24._0_12_;
      auVar39._12_2_ = auVar24._6_2_;
      auVar39._14_2_ = *(undefined2 *)((long)auStack_17e8 + lVar12 + 6);
      auVar38._12_4_ = auVar39._12_4_;
      auVar38._0_10_ = auVar24._0_10_;
      auVar38._10_2_ = *(undefined2 *)((long)auStack_17e8 + lVar12 + 4);
      auVar37._10_6_ = auVar38._10_6_;
      auVar37._0_8_ = auVar24._0_8_;
      auVar37._8_2_ = auVar24._4_2_;
      auVar7._4_8_ = auVar37._8_8_;
      auVar7._2_2_ = *(undefined2 *)((long)auStack_17e8 + lVar12 + 2);
      auVar7._0_2_ = auVar24._2_2_;
      auVar36._0_4_ = CONCAT22(*(undefined2 *)((long)auStack_17e8 + lVar12),auVar24._0_2_);
      auVar36._4_12_ = auVar7;
      auVar31 = *(undefined1 (*) [16])((long)auStack_17e8 + lVar12 + 0x10);
      uVar3 = *(undefined2 *)((long)auStack_17c8 + lVar12);
      auVar57._0_12_ = auVar31._0_12_;
      auVar57._12_2_ = auVar31._6_2_;
      auVar57._14_2_ = *(undefined2 *)((long)auStack_17c8 + lVar12 + 6);
      auVar56._12_4_ = auVar57._12_4_;
      auVar56._0_10_ = auVar31._0_10_;
      auVar56._10_2_ = *(undefined2 *)((long)auStack_17c8 + lVar12 + 4);
      auVar55._10_6_ = auVar56._10_6_;
      auVar55._0_8_ = auVar31._0_8_;
      auVar55._8_2_ = auVar31._4_2_;
      auVar8._4_8_ = auVar55._8_8_;
      auVar8._2_2_ = *(undefined2 *)((long)auStack_17c8 + lVar12 + 2);
      auVar8._0_2_ = auVar31._2_2_;
      uVar17 = CONCAT22(*(undefined2 *)((long)auStack_1828 + lVar12 + 8),auVar19._8_2_);
      auVar18._0_8_ =
           CONCAT26(*(undefined2 *)((long)auStack_1828 + lVar12 + 10),
                    CONCAT24(auVar19._10_2_,uVar17));
      auVar18._8_2_ = auVar19._12_2_;
      auVar18._10_2_ = *(undefined2 *)((long)auStack_1828 + lVar12 + 0xc);
      auVar20._12_2_ = auVar19._14_2_;
      auVar20._0_12_ = auVar18;
      auVar20._14_2_ = *(undefined2 *)((long)auStack_1828 + lVar12 + 0xe);
      uVar41 = CONCAT22(*(undefined2 *)((long)auStack_1808 + lVar12 + 8),auVar34._8_2_);
      auVar42._0_8_ =
           CONCAT26(*(undefined2 *)((long)auStack_1808 + lVar12 + 10),
                    CONCAT24(auVar34._10_2_,uVar41));
      auVar42._8_2_ = auVar34._12_2_;
      auVar42._10_2_ = *(undefined2 *)((long)auStack_1808 + lVar12 + 0xc);
      auVar43._12_2_ = auVar34._14_2_;
      auVar43._0_12_ = auVar42;
      auVar43._14_2_ = *(undefined2 *)((long)auStack_1808 + lVar12 + 0xe);
      uVar22 = CONCAT22(*(undefined2 *)((long)auStack_17e8 + lVar12 + 8),auVar24._8_2_);
      auVar23._0_8_ =
           CONCAT26(*(undefined2 *)((long)auStack_17e8 + lVar12 + 10),
                    CONCAT24(auVar24._10_2_,uVar22));
      auVar23._8_2_ = auVar24._12_2_;
      auVar23._10_2_ = *(undefined2 *)((long)auStack_17e8 + lVar12 + 0xc);
      auVar24._12_2_ = auVar24._14_2_;
      auVar24._0_12_ = auVar23;
      auVar24._14_2_ = *(undefined2 *)((long)auStack_17e8 + lVar12 + 0xe);
      uVar51 = CONCAT22(*(undefined2 *)((long)auStack_17c8 + lVar12 + 8),auVar31._8_2_);
      auVar52._0_8_ =
           CONCAT26(*(undefined2 *)((long)auStack_17c8 + lVar12 + 10),
                    CONCAT24(auVar31._10_2_,uVar51));
      auVar52._8_2_ = auVar31._12_2_;
      auVar52._10_2_ = *(undefined2 *)((long)auStack_17c8 + lVar12 + 0xc);
      auVar53._12_2_ = auVar31._14_2_;
      auVar53._0_12_ = auVar52;
      auVar53._14_2_ = *(undefined2 *)((long)auStack_17c8 + lVar12 + 0xe);
      auVar45._0_8_ = auVar28._0_8_;
      auVar45._8_4_ = auVar5._0_4_;
      auVar45._12_4_ = auVar6._0_4_;
      auVar46._0_8_ = auVar36._0_8_;
      auVar46._8_4_ = auVar7._0_4_;
      auVar46._12_4_ = auVar8._0_4_;
      auVar50._8_4_ = (int)((ulong)auVar18._0_8_ >> 0x20);
      auVar50._0_8_ = auVar18._0_8_;
      auVar50._12_4_ = (int)((ulong)auVar42._0_8_ >> 0x20);
      auVar54._8_4_ = (int)((ulong)auVar23._0_8_ >> 0x20);
      auVar54._0_8_ = auVar23._0_8_;
      auVar54._12_4_ = (int)((ulong)auVar52._0_8_ >> 0x20);
      auVar32._0_8_ = CONCAT44(auVar47._8_4_,auVar29._8_4_);
      auVar32._8_4_ = auVar30._12_4_;
      auVar32._12_4_ = auVar48._12_4_;
      auVar40._0_8_ = CONCAT44(auVar55._8_4_,auVar37._8_4_);
      auVar40._8_4_ = auVar38._12_4_;
      auVar40._12_4_ = auVar56._12_4_;
      auVar25._0_8_ = CONCAT44(auVar52._8_4_,auVar23._8_4_);
      auVar25._8_4_ = auVar24._12_4_;
      auVar25._12_4_ = auVar53._12_4_;
      *(ulong *)(puVar16 + lVar12 * 4 + -0x70) =
           CONCAT44(CONCAT22(*(undefined2 *)((long)auStack_1808 + lVar12),auVar34._0_2_),
                    auVar28._0_4_);
      *(ulong *)((long)(puVar16 + lVar12 * 4 + -0x70) + 8) =
           CONCAT44(CONCAT22(uVar3,auVar31._0_2_),auVar36._0_4_);
      *(long *)(puVar16 + lVar12 * 4 + -0x60) = auVar45._8_8_;
      *(long *)((long)(puVar16 + lVar12 * 4 + -0x60) + 8) = auVar46._8_8_;
      auVar44._8_8_ = auVar40._0_8_;
      auVar44._0_8_ = auVar32._0_8_;
      *(undefined1 (*) [16])(puVar16 + lVar12 * 4 + -0x50) = auVar44;
      *(long *)(puVar16 + lVar12 * 4 + -0x40) = auVar32._8_8_;
      *(long *)((long)(puVar16 + lVar12 * 4 + -0x40) + 8) = auVar40._8_8_;
      *(ulong *)(puVar16 + lVar12 * 4 + -0x30) = CONCAT44(uVar41,uVar17);
      *(ulong *)((long)(puVar16 + lVar12 * 4 + -0x30) + 8) = CONCAT44(uVar51,uVar22);
      *(long *)(puVar16 + lVar12 * 4 + -0x20) = auVar50._8_8_;
      *(long *)((long)(puVar16 + lVar12 * 4 + -0x20) + 8) = auVar54._8_8_;
      puVar1 = (undefined4 *)(puVar16 + lVar12 * 4 + -0x10);
      *puVar1 = auVar18._8_4_;
      puVar1[1] = auVar42._8_4_;
      *(undefined8 *)(puVar1 + 2) = auVar25._0_8_;
      *(int *)(puVar16 + lVar12 * 4 + 8) = auVar20._12_4_;
      *(int *)(puVar16 + lVar12 * 4 + 0xc) = auVar43._12_4_;
      *(long *)(puVar16 + lVar12 * 4 + 8) = auVar25._8_8_;
      lVar12 = lVar12 + 0x80;
    } while (lVar12 != 0x200);
    lVar15 = lVar15 + 1;
    input = input + 8;
    puVar16 = puVar16 + 0x80;
  } while (lVar15 != 4);
  piVar14 = output + 4;
  puVar16 = local_1038;
  lVar15 = 0;
  do {
    lVar12 = 0;
    do {
      auVar19 = *(undefined1 (*) [16])(puVar16 + lVar12);
      auVar25 = pmovsxwd(auVar25,auVar19);
      *(undefined1 (*) [16])((long)&local_1238 + lVar12) = auVar25;
      auVar21._8_4_ = auVar19._8_4_;
      auVar21._12_4_ = auVar19._12_4_;
      auVar21._0_8_ = auVar19._8_8_;
      auVar19 = pmovsxwd(auVar21,auVar21);
      *(undefined1 (*) [16])((long)&local_1438 + lVar12) = auVar19;
      lVar12 = lVar12 + 0x10;
    } while (lVar12 != 0x200);
    av1_fdct32_sse4_1((__m128i *)&local_1238,(__m128i *)&local_1238,0xb,1);
    av1_fdct32_sse4_1((__m128i *)&local_1438,(__m128i *)&local_1438,0xb,1);
    bVar2 = piVar9[2];
    if ((char)bVar2 < '\0') {
      iVar13 = 1 << (~bVar2 & 0x1f);
      auVar19 = ZEXT416((uint)-(int)(char)bVar2);
      lVar12 = 0;
      auVar40 = pmovsxwd(auVar40,0x16a116a116a116a1);
      auVar44 = pmovsxwd(auVar44,0x800080008000800);
      do {
        auVar33._0_4_ = *(int *)((long)&local_1238 + lVar12) + iVar13 >> auVar19;
        auVar33._4_4_ = *(int *)((long)&local_1238 + lVar12 + 4) + iVar13 >> auVar19;
        auVar33._8_4_ = *(int *)((long)aiStack_1230 + lVar12) + iVar13 >> auVar19;
        auVar33._12_4_ = *(int *)((long)aiStack_1230 + lVar12 + 4) + iVar13 >> auVar19;
        auVar34 = pmulld(auVar33,auVar40);
        *(int *)((long)&local_1238 + lVar12) = auVar34._0_4_ + auVar44._0_4_ >> 0xc;
        *(int *)((long)&local_1238 + lVar12 + 4) = auVar34._4_4_ + auVar44._4_4_ >> 0xc;
        *(int *)((long)aiStack_1230 + lVar12) = auVar34._8_4_ + auVar44._8_4_ >> 0xc;
        *(int *)((long)aiStack_1230 + lVar12 + 4) = auVar34._12_4_ + auVar44._12_4_ >> 0xc;
        lVar12 = lVar12 + 0x10;
      } while (lVar12 != 0x200);
    }
    else {
      lVar12 = 0;
      auVar40 = pmovsxwd(auVar40,0x16a116a116a116a1);
      auVar44 = pmovsxwd(auVar44,0x800080008000800);
      do {
        auVar26._0_4_ = *(int *)((long)&local_1238 + lVar12) << (int)(char)bVar2;
        auVar26._4_4_ = *(undefined4 *)((long)&local_1238 + lVar12 + 4);
        auVar26._8_4_ = *(undefined4 *)((long)aiStack_1230 + lVar12);
        auVar26._12_4_ = *(undefined4 *)((long)aiStack_1230 + lVar12 + 4);
        auVar19 = pmulld(auVar26,auVar40);
        *(int *)((long)&local_1238 + lVar12) = auVar19._0_4_ + auVar44._0_4_ >> 0xc;
        *(int *)((long)&local_1238 + lVar12 + 4) = auVar19._4_4_ + auVar44._4_4_ >> 0xc;
        *(int *)((long)aiStack_1230 + lVar12) = auVar19._8_4_ + auVar44._8_4_ >> 0xc;
        *(int *)((long)aiStack_1230 + lVar12 + 4) = auVar19._12_4_ + auVar44._12_4_ >> 0xc;
        lVar12 = lVar12 + 0x10;
      } while (lVar12 != 0x200);
    }
    bVar2 = piVar9[2];
    if ((char)bVar2 < '\0') {
      iVar13 = 1 << (~bVar2 & 0x1f);
      auVar25 = ZEXT416((uint)-(int)(char)bVar2);
      lVar12 = 0;
      do {
        auVar35._0_4_ = *(int *)((long)&local_1438 + lVar12) + iVar13 >> auVar25;
        auVar35._4_4_ = *(int *)((long)&local_1438 + lVar12 + 4) + iVar13 >> auVar25;
        auVar35._8_4_ = *(int *)((long)aiStack_1430 + lVar12) + iVar13 >> auVar25;
        auVar35._12_4_ = *(int *)((long)aiStack_1430 + lVar12 + 4) + iVar13 >> auVar25;
        auVar19 = pmulld(auVar35,auVar40);
        *(int *)((long)&local_1438 + lVar12) = auVar19._0_4_ + auVar44._0_4_ >> 0xc;
        *(int *)((long)&local_1438 + lVar12 + 4) = auVar19._4_4_ + auVar44._4_4_ >> 0xc;
        *(int *)((long)aiStack_1430 + lVar12) = auVar19._8_4_ + auVar44._8_4_ >> 0xc;
        *(int *)((long)aiStack_1430 + lVar12 + 4) = auVar19._12_4_ + auVar44._12_4_ >> 0xc;
        lVar12 = lVar12 + 0x10;
      } while (lVar12 != 0x200);
    }
    else {
      lVar12 = 0;
      do {
        auVar27._0_4_ = *(int *)((long)&local_1438 + lVar12) << (int)(char)bVar2;
        auVar27._4_4_ = *(undefined4 *)((long)&local_1438 + lVar12 + 4);
        auVar27._8_4_ = *(undefined4 *)((long)aiStack_1430 + lVar12);
        auVar27._12_4_ = *(undefined4 *)((long)aiStack_1430 + lVar12 + 4);
        auVar19 = pmulld(auVar27,auVar40);
        auVar25._0_4_ = auVar19._0_4_ + auVar44._0_4_ >> 0xc;
        auVar25._4_4_ = auVar19._4_4_ + auVar44._4_4_ >> 0xc;
        auVar25._8_4_ = auVar19._8_4_ + auVar44._8_4_ >> 0xc;
        auVar25._12_4_ = auVar19._12_4_ + auVar44._12_4_ >> 0xc;
        *(undefined1 (*) [16])((long)&local_1438 + lVar12) = auVar25;
        lVar12 = lVar12 + 0x10;
      } while (lVar12 != 0x200);
    }
    lVar12 = 0;
    do {
      uVar4 = *(undefined8 *)((long)aiStack_1230 + lVar12);
      *(undefined8 *)(piVar14 + lVar12 * 2 + -4) = *(undefined8 *)((long)&local_1238 + lVar12);
      *(undefined8 *)(piVar14 + lVar12 * 2 + -4 + 2) = uVar4;
      uVar4 = *(undefined8 *)((long)aiStack_1430 + lVar12);
      *(undefined8 *)(piVar14 + lVar12 * 2) = *(undefined8 *)((long)&local_1438 + lVar12);
      *(undefined8 *)(piVar14 + lVar12 * 2 + 2) = uVar4;
      lVar12 = lVar12 + 0x10;
    } while (lVar12 != 0x200);
    lVar15 = lVar15 + 1;
    puVar16 = puVar16 + 0x200;
    piVar14 = piVar14 + 8;
  } while (lVar15 != 4);
  return;
}

Assistant:

static void lowbd_fwd_txfm2d_32x64_sse4_1(const int16_t *input, int32_t *output,
                                          int stride, TX_TYPE tx_type, int bd) {
  (void)bd;
  (void)tx_type;
  assert(tx_type == DCT_DCT);
  const TX_SIZE tx_size = TX_32X64;
  __m128i buf0[64], buf1[256];
  const int8_t *shift = av1_fwd_txfm_shift_ls[tx_size];
  const int txw_idx = get_txw_idx(tx_size);
  const int txh_idx = get_txh_idx(tx_size);
  const int cos_bit_col = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  const int cos_bit_row = av1_fwd_cos_bit_row[txw_idx][txh_idx];
  const int width = tx_size_wide[tx_size];
  const int height = tx_size_high[tx_size];
  const transform_1d_sse2 col_txfm = av1_fdct8x64_new_sse2;
  const int width_div8 = (width >> 3);
  const int height_div8 = (height >> 3);

  for (int i = 0; i < width_div8; i++) {
    load_buffer_16bit_to_16bit(input + 8 * i, stride, buf0, height);
    round_shift_16bit(buf0, height, shift[0]);
    col_txfm(buf0, buf0, cos_bit_col);
    round_shift_16bit(buf0, height, shift[1]);
    for (int j = 0; j < AOMMIN(4, height_div8); ++j) {
      transpose_16bit_8x8(buf0 + j * 8, buf1 + j * width + 8 * i);
    }
  }

  for (int i = 0; i < AOMMIN(4, height_div8); i++) {
    __m128i bufA[32];
    __m128i bufB[32];
    __m128i *buf = buf1 + width * i;
    for (int j = 0; j < width; ++j) {
      bufA[j] = _mm_cvtepi16_epi32(buf[j]);
      bufB[j] = _mm_cvtepi16_epi32(_mm_unpackhi_epi64(buf[j], buf[j]));
    }
    av1_fdct32_sse4_1(bufA, bufA, cos_bit_row, 1);
    av1_fdct32_sse4_1(bufB, bufB, cos_bit_row, 1);
    av1_round_shift_rect_array_32_sse4_1(bufA, bufA, 32, -shift[2], NewSqrt2);
    av1_round_shift_rect_array_32_sse4_1(bufB, bufB, 32, -shift[2], NewSqrt2);

    store_output_32bit_w8(output + i * 8, bufA, bufB, 32, 32);
  }
}